

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jh_vector.h
# Opt level: O0

void __thiscall
JetHead::vector<Regex::GroupData>::resize(vector<Regex::GroupData> *this,uint newSize)

{
  uint local_1c;
  uint local_18;
  uint i_1;
  uint i;
  uint newSize_local;
  vector<Regex::GroupData> *this_local;
  
  local_18 = newSize;
  if (this->mAllocated < newSize) {
    if (newSize < this->mAllocated << 1) {
      sizeup(this,0);
    }
    else {
      sizeup(this,newSize);
    }
  }
  for (; local_18 < this->mSize; local_18 = local_18 + 1) {
    Regex::GroupData::~GroupData(this->mData + local_18);
  }
  for (local_1c = this->mSize; local_1c < newSize; local_1c = local_1c + 1) {
    Regex::GroupData::GroupData(this->mData + local_1c);
  }
  this->mSize = newSize;
  return;
}

Assistant:

void resize(unsigned newSize)
		{
			// If we need more allocation, do it now
			if (mAllocated < newSize)
			{
				if (newSize < mAllocated * 2)
				{
					sizeup();
				} else {
					sizeup(newSize);
				}
			}

			// If we are shrinking (newSize < mSize), destroy
			// everything that is now off the end of the vector
			for (unsigned i = newSize; i < mSize; i++)
			{
				mData[i].~T();
			}

			// If we are growing (mSize < newSize), then call the
			// default constructor on all the objects we just 
			// implicitly created
			for (unsigned i = mSize; i < newSize; i++)
			{
				new(mData + i) T();
			}
			
			// Remember our new size
			mSize = newSize;
		}